

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_AActor_A_FreezeDeath
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  AActor *pAVar4;
  bool bVar5;
  bool local_63;
  TFlags<ActorFlag3,_unsigned_int> local_60;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  FSoundID local_58;
  undefined1 local_54 [4];
  TFlags<ActorFlag2,_unsigned_int> local_50;
  TFlags<ActorFlag2,_unsigned_int> local_4c;
  undefined1 local_48 [4];
  TFlags<ActorFlag,_unsigned_int> local_44;
  TFlags<ActorFlag,_unsigned_int> local_40;
  int local_3c;
  AActor *pAStack_38;
  int t;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x55,
                  "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    pAStack_38 = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (pAStack_38 != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)pAStack_38,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      local_3c = FRandom::operator()(&pr_freezedeath);
      iVar1 = local_3c + 0x4b;
      iVar2 = FRandom::operator()(&pr_freezedeath);
      pAStack_38->tics = iVar1 + iVar2;
      operator|((EnumType)local_48,MF_SOLID);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_44,(ActorFlag)local_48);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_40,(ActorFlag)&local_44);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&pAStack_38->flags,&local_40);
      operator|((EnumType)local_54,MF2_PUSHABLE);
      TFlags<ActorFlag2,_unsigned_int>::operator|(&local_50,(ActorFlag2)local_54);
      TFlags<ActorFlag2,_unsigned_int>::operator|(&local_4c,(ActorFlag2)&local_50);
      TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAStack_38->flags2,&local_4c);
      TFlags<ActorFlag3,_unsigned_int>::operator|=(&pAStack_38->flags3,MF3_CRASHED);
      pAVar4 = AActor::GetDefault(pAStack_38);
      pAStack_38->Height = pAVar4->Height;
      if ((3 < (pAStack_38->RenderStyle).field_0.BlendOp) &&
         ((pAStack_38->RenderStyle).field_0.BlendOp < 8)) {
        FRenderStyle::operator=((FRenderStyle *)&(pAStack_38->RenderStyle).field_0,STYLE_Normal);
      }
      pAVar4 = pAStack_38;
      FSoundID::FSoundID(&local_58,"misc/freeze");
      S_Sound(pAVar4,4,&local_58,1.0,1.0);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_5c,
                 (int)pAStack_38 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
      if (uVar3 != 0) {
        pAStack_38->Alpha = 1.0;
        pAStack_38->visdir = '\0';
      }
      if (pAStack_38->player == (player_t *)0x0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_60,
                   (int)pAStack_38 +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
        bVar5 = false;
        if (uVar3 != 0) {
          bVar5 = pAStack_38->special != 0;
        }
        if (bVar5) {
          P_ExecuteSpecial(pAStack_38->special,(line_t *)0x0,pAStack_38,false,pAStack_38->args[0],
                           pAStack_38->args[1],pAStack_38->args[2],pAStack_38->args[3],
                           pAStack_38->args[4]);
          pAStack_38->special = 0;
        }
      }
      else {
        pAStack_38->player->damagecount = 0;
        pAStack_38->player->poisoncount = 0;
        pAStack_38->player->bonuscount = 0;
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x55,
                  "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x55,
                "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_SELF_PROLOGUE(AActor);

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}